

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void __thiscall SFFile::TranslatePercussionPresetZone(SFFile *this,SFPreset *preset,SFBag *pzone)

{
  undefined1 local_a0 [8];
  SFPerc perc;
  SFInst *inst;
  int i;
  int key;
  SFBag *pzone_local;
  SFPreset *preset_local;
  SFFile *this_local;
  
  for (inst._4_4_ = (uint)(pzone->KeyRange).Lo; (int)inst._4_4_ <= (int)(uint)(pzone->KeyRange).Hi;
      inst._4_4_ = inst._4_4_ + 1) {
    perc._104_8_ = this->Instruments + pzone->Target;
    for (inst._0_4_ = (uint)((SFInst *)perc._104_8_)->BagIndex;
        (int)(uint)inst < (int)(uint)*(ushort *)(perc._104_8_ + 0x2e); inst._0_4_ = (uint)inst + 1)
    {
      if ((((-1 < this->InstrBags[(int)(uint)inst].Target) &&
           ((int)(uint)this->InstrBags[(int)(uint)inst].KeyRange.Lo <= (int)inst._4_4_)) &&
          ((int)inst._4_4_ <= (int)(uint)this->InstrBags[(int)(uint)inst].KeyRange.Hi)) &&
         ((this->InstrBags[(int)(uint)inst].VelRange.Lo <= (pzone->VelRange).Hi &&
          ((pzone->VelRange).Lo <= this->InstrBags[(int)(uint)inst].VelRange.Hi)))) {
        perc.Generators.velocity._0_1_ = preset->field_0x15 & 0x7f;
        local_a0 = (undefined1  [8])preset;
        memcpy(&perc,&DefaultGenerators,0x66);
        if (*(char *)(perc._104_8_ + 0x15) < '\0') {
          SetInstrumentGenerators
                    (this,(SFGenComposite *)&perc,
                     (uint)this->InstrBags[*(ushort *)(perc._104_8_ + 0x16)].GenIndex,
                     (uint)this->InstrBags[(int)(*(ushort *)(perc._104_8_ + 0x16) + 1)].GenIndex);
        }
        SetInstrumentGenerators
                  (this,(SFGenComposite *)&perc,(uint)this->InstrBags[(int)(uint)inst].GenIndex,
                   (uint)this->InstrBags[(int)((uint)inst + 1)].GenIndex);
        AddPresetGenerators(this,(SFGenComposite *)&perc,(uint)pzone->GenIndex,
                            (uint)pzone[1].GenIndex,preset);
        perc.Preset._0_1_ = (undefined1)preset->Program;
        perc.Preset._1_1_ = (undefined1)inst._4_4_;
        perc.Preset._2_1_ =
             MAX<unsigned_char>((pzone->VelRange).Lo,this->InstrBags[(int)(uint)inst].VelRange.Lo);
        perc.Preset._3_1_ =
             MIN<unsigned_char>((pzone->VelRange).Hi,this->InstrBags[(int)(uint)inst].VelRange.Hi);
        perc.Preset._4_2_ = (undefined2)this->InstrBags[(int)(uint)inst].Target;
        TArray<SFPerc,_SFPerc>::Push(&this->Percussion,(SFPerc *)local_a0);
      }
    }
  }
  return;
}

Assistant:

void SFFile::TranslatePercussionPresetZone(SFPreset *preset, SFBag *pzone)
{
	int key, i;

	for (key = pzone->KeyRange.Lo; key <= pzone->KeyRange.Hi; ++key)
	{
		SFInst *inst = &Instruments[pzone->Target];
		for (i = inst->BagIndex; i < (inst + 1)->BagIndex; ++i)
		{
			if (InstrBags[i].Target < 0)
			{ // This instrument zone has no sample.
				continue;
			}
			if (InstrBags[i].KeyRange.Lo > key || InstrBags[i].KeyRange.Hi < key)
			{ // This instrument zone does not contain the key we want.
				continue;
			}
			if (InstrBags[i].VelRange.Lo > pzone->VelRange.Hi ||
				InstrBags[i].VelRange.Hi < pzone->VelRange.Lo)
			{ // This instrument zone does not intersect the current velocity range.
				continue;
			}
			// An intersection! Add the composite generator for this key and velocity range.
			SFPerc perc;
			perc.LoadOrder = preset->LoadOrder;
			perc.Preset = preset;
			perc.Generators = DefaultGenerators;
			if (inst->bHasGlobalZone)
			{
				SetInstrumentGenerators(&perc.Generators, InstrBags[inst->BagIndex].GenIndex, InstrBags[inst->BagIndex + 1].GenIndex);
			}
			SetInstrumentGenerators(&perc.Generators, InstrBags[i].GenIndex, InstrBags[i + 1].GenIndex);
			AddPresetGenerators(&perc.Generators, pzone->GenIndex, (pzone + 1)->GenIndex, preset);
			perc.Generators.drumset = (BYTE)preset->Program;
			perc.Generators.key = key;
			perc.Generators.velRange.Lo = MAX(pzone->VelRange.Lo, InstrBags[i].VelRange.Lo);
			perc.Generators.velRange.Hi = MIN(pzone->VelRange.Hi, InstrBags[i].VelRange.Hi);
			perc.Generators.sampleID = InstrBags[i].Target;
			Percussion.Push(perc);
		}
	}
}